

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn.c
# Opt level: O2

cmn_t * cmn_init(int32 veclen)

{
  cmn_t *cmn;
  mfcc_t *pmVar1;
  size_t n_elem;
  
  cmn = (cmn_t *)__ckd_calloc__(1,0x30,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn.c"
                                ,0x98);
  cmn->refcount = 1;
  cmn->veclen = veclen;
  n_elem = (size_t)veclen;
  pmVar1 = (mfcc_t *)
           __ckd_calloc__(n_elem,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn.c"
                          ,0x9b);
  cmn->cmn_mean = pmVar1;
  pmVar1 = (mfcc_t *)
           __ckd_calloc__(n_elem,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn.c"
                          ,0x9c);
  cmn->cmn_var = pmVar1;
  pmVar1 = (mfcc_t *)
           __ckd_calloc__(n_elem,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn.c"
                          ,0x9d);
  cmn->sum = pmVar1;
  cmn->nframe = 0;
  cmn_update_repr(cmn);
  return cmn;
}

Assistant:

cmn_t *
cmn_init(int32 veclen)
{
    cmn_t *cmn;
    cmn = (cmn_t *) ckd_calloc(1, sizeof(cmn_t));
    cmn->refcount = 1;
    cmn->veclen = veclen;
    cmn->cmn_mean = (mfcc_t *) ckd_calloc(veclen, sizeof(mfcc_t));
    cmn->cmn_var = (mfcc_t *) ckd_calloc(veclen, sizeof(mfcc_t));
    cmn->sum = (mfcc_t *) ckd_calloc(veclen, sizeof(mfcc_t));
    cmn->nframe = 0;
    cmn_update_repr(cmn);

    return cmn;
}